

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)20,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  StrWriter *pSVar6;
  char cVar7;
  undefined6 in_register_0000000a;
  uint uVar8;
  
  uVar8 = *addr + 2;
  *addr = uVar8;
  iVar4 = (*this->_vptr_Moira[6])(this,(ulong)uVar8,addr,CONCAT62(in_register_0000000a,op));
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    cVar7 = 'b';
    lVar5 = 1;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar7;
      cVar7 = "fdblt"[lVar5 + 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pSVar6 = StrWriter::operator<<(str);
    if ((pSVar6->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar2 = (str->tab).raw;
      do {
        pcVar3 = pSVar6->ptr;
        pSVar6->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (pSVar6->ptr < pSVar6->base + iVar2);
      goto LAB_001e8d5c;
    }
  }
  else {
    cVar7 = 'b';
    pSVar6 = str;
    if (SVar1 == MUSASHI) {
      lVar5 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar7;
        cVar7 = "fdblt"[lVar5 + 2];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar2);
        goto LAB_001e8d5c;
      }
    }
    else {
      lVar5 = 1;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar7;
        cVar7 = "fdblt"[lVar5 + 2];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar2 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar2);
        goto LAB_001e8d5c;
      }
    }
  }
  pcVar3 = pSVar6->ptr;
  pSVar6->ptr = pcVar3 + 1;
  *pcVar3 = ' ';
LAB_001e8d5c:
  StrWriter::operator<<(pSVar6,(UInt)(uVar8 + (int)(short)iVar4));
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}